

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

int lyp_yin_fill_ext(void *parent,LYEXT_PAR parent_type,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
                    lys_module *module,lyxml_elem *yin,lys_ext_instance ***ext,uint8_t ext_index,
                    unres_schema *unres)

{
  int iVar1;
  lys_node *snode;
  
  snode = (lys_node *)malloc(0x30);
  lyxml_unlink(module->ctx,yin);
  snode->name = &yin->flags;
  *(undefined4 *)&snode->dsc = 2;
  snode->ref = (char *)parent;
  *(lys_module **)&snode->flags = module;
  *(LYEXT_PAR *)&snode->ext = parent_type;
  *(LYEXT_SUBSTMT *)((long)&snode->ext + 4) = substmt;
  *(uint8_t *)&snode->iffeature = substmt_index;
  *(uint8_t *)((long)&snode->iffeature + 1) = ext_index;
  iVar1 = unres_schema_add_node(module,unres,ext,UNRES_EXT,snode);
  return (int)(iVar1 == -1);
}

Assistant:

int
lyp_yin_fill_ext(void *parent, LYEXT_PAR parent_type, LYEXT_SUBSTMT substmt, uint8_t substmt_index,
             struct lys_module *module, struct lyxml_elem *yin, struct lys_ext_instance ***ext,
             uint8_t ext_index, struct unres_schema *unres)
{
    struct unres_ext *info;

    info = malloc(sizeof *info);
    lyxml_unlink(module->ctx, yin);
    info->data.yin = yin;
    info->datatype = LYS_IN_YIN;
    info->parent = parent;
    info->mod = module;
    info->parent_type = parent_type;
    info->substmt = substmt;
    info->substmt_index = substmt_index;
    info->ext_index = ext_index;

    if (unres_schema_add_node(module, unres, ext, UNRES_EXT, (struct lys_node *)info) == -1) {
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}